

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

Boolean MA_free_heap_piece(Integer memhandle,Integer nelem)

{
  Boolean BVar1;
  AD *ad_00;
  AD *pAVar2;
  ulongi uVar3;
  long in_RSI;
  char *in_RDI;
  ulongi nbytes;
  Pointer client_space;
  AR ar;
  AD *ad_reclaim;
  AD *ad;
  ulong in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  Integer in_stack_ffffffffffffffd0;
  AD *in_stack_ffffffffffffffd8;
  AD *local_20;
  undefined8 in_stack_fffffffffffffff8;
  
  ma_stats.calls[4] = ma_stats.calls[4] + 1;
  BVar1 = mh2ad((Integer)client_space,(AD **)nbytes,
                (BlockLocation)((ulong)in_stack_fffffffffffffff8 >> 0x20),in_RDI);
  if (BVar1 == 0) {
    BVar1 = 0;
  }
  else if (in_RSI < 0) {
    sprintf(ma_ebuf,"block \'%s\', invalid nelem: %ld",local_20->name,in_RSI);
    ma_error((ErrorLevel)((ulong)in_stack_ffffffffffffffd0 >> 0x20),
             (ErrorType)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0);
    BVar1 = 0;
  }
  else if (in_RSI < local_20->nelem) {
    if (ma_trace != 0) {
      printf("MA: freeing %ld elements of \'%s\'\n",in_RSI,local_20->name);
    }
    BVar1 = local_20->datatype;
    ad_00 = (AD *)(local_20->nelem - in_RSI);
    balloc_after((AR *)&stack0xffffffffffffffc8,(Pointer)local_20,
                 (Pointer *)&stack0xffffffffffffffc0,(ulongi *)&stack0xffffffffffffffb8);
    if ((in_stack_ffffffffffffffb8 < local_20->nbytes) &&
       (pAVar2 = block_split(in_stack_ffffffffffffffd8,(ulongi)ad_00,BVar1), pAVar2 != (AD *)0x0)) {
      ma_stats.hbytes = ma_stats.hbytes - pAVar2->nbytes;
      block_free_heap(ad_00);
    }
    local_20->nelem = (Integer)ad_00;
    uVar3 = checksum(local_20);
    local_20->checksum = uVar3;
    guard_set(local_20);
    BVar1 = 1;
  }
  else {
    BVar1 = MA_free_heap(in_stack_ffffffffffffffb8);
  }
  return BVar1;
}

Assistant:

public Boolean MA_free_heap_piece(
    Integer    memhandle,    /* the block to deallocate a piece of */
    Integer    nelem         /* # of elements to deallocate */)
{
    AD        *ad;        /* AD for memhandle */
    AD        *ad_reclaim;    /* AD for data returned */
    AR        ar;        /* AR for data kept */
    Pointer    client_space;    /* location of client_space */
    ulongi    nbytes;        /* length of block for data kept */

#ifdef STATS
    ma_stats.calls[(int)FID_MA_free_heap_piece]++;
#endif /* STATS */

#ifdef VERIFY
    if (ma_auto_verify && !MA_verify_allocator_stuff())
        return MA_FALSE;
#endif /* VERIFY */

    /* verify memhandle and convert to AD */
    if (!mh2ad(memhandle, &ad, BL_Heap, "MA_free_heap_piece"))
        return MA_FALSE;

    /* verify nelem */
    if (nelem < 0)
    {
        (void)sprintf(ma_ebuf,
            "block '%s', invalid nelem: %ld",
            ad->name, (size_t)nelem);
        ma_error(EL_Nonfatal, ET_External, "MA_free_heap_piece", ma_ebuf);
        return MA_FALSE;
    }
    else if (nelem >= ad->nelem)
    {
        /* deallocate the whole block */
        return MA_free_heap(memhandle);
    }

    if (ma_trace) 
    (void)printf("MA: freeing %ld elements of '%s'\n",
            (size_t)nelem, ad->name);

    /* set AR for data to keep */
    ar.datatype = ad->datatype;
    ar.nelem = ad->nelem - nelem;

    /* perform trial allocation to determine size */
    balloc_after(&ar, (Pointer)ad, &client_space, &nbytes);

    if (nbytes < ad->nbytes)
    {
        /* ad has extra space; split block if possible */
        ad_reclaim = block_split(ad, nbytes, (Boolean)MA_FALSE);

        if (ad_reclaim)
        {
#ifdef STATS
            ma_stats.hbytes -= ad_reclaim->nbytes;
#endif /* STATS */

            /* reclaim the deallocated (new) block */
            block_free_heap(ad_reclaim);
        }
    }

    /* update surviving block */
    ad->nelem = ar.nelem;
    ad->checksum = checksum(ad);

    /* set the guards */
    guard_set(ad);

#ifdef DEBUG
    debug_ad_print(ad);
#endif /* DEBUG */

    /* success */
    return MA_TRUE;
}